

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O1

HighsInt Highs_getBoolOptionValues
                   (void *highs,char *option,HighsInt *current_value,HighsInt *default_value)

{
  HighsStatus HVar1;
  bool default_v;
  bool current_v;
  bool local_4b;
  bool local_4a;
  allocator local_49;
  string local_48;
  
  std::__cxx11::string::string((string *)&local_48,option,&local_49);
  HVar1 = Highs::getBoolOptionValues((Highs *)highs,&local_48,&local_4a,&local_4b);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if (current_value != (HighsInt *)0x0) {
    *current_value = (uint)local_4a;
  }
  if (default_value != (HighsInt *)0x0) {
    *default_value = (uint)local_4b;
  }
  return HVar1;
}

Assistant:

HighsInt Highs_getBoolOptionValues(const void* highs, const char* option,
                                   HighsInt* current_value,
                                   HighsInt* default_value) {
  bool current_v;
  bool default_v;
  HighsInt retcode =
      (HighsInt)((Highs*)highs)
          ->getBoolOptionValues(std::string(option), &current_v, &default_v);
  if (current_value) *current_value = current_v;
  if (default_value) *default_value = default_v;
  return retcode;
}